

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O0

al_fixed al_fixhypot(al_fixed x,al_fixed y)

{
  al_fixed aVar1;
  al_fixed in_ESI;
  al_fixed in_EDI;
  double dVar2;
  double dVar3;
  double in_stack_ffffffffffffffe8;
  
  dVar2 = al_fixtof(in_EDI);
  dVar3 = al_fixtof(in_ESI);
  hypotf((float)dVar2,(float)dVar3);
  aVar1 = al_ftofix(in_stack_ffffffffffffffe8);
  return aVar1;
}

Assistant:

al_fixed al_fixhypot(al_fixed x, al_fixed y)
{
   return al_ftofix(hypotf(al_fixtof(x), al_fixtof(y)));
}